

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O0

string * __thiscall banksia::ChessBoard::toString_abi_cxx11_(ChessBoard *this)

{
  int iVar1;
  ostream *poVar2;
  ulong uVar3;
  void *this_00;
  long *in_RSI;
  string *in_RDI;
  int row;
  Piece piece;
  int i;
  ostringstream stringStream;
  BoardCore *in_stack_fffffffffffffdb8;
  ostream *in_stack_fffffffffffffde8;
  string local_1e0 [32];
  Piece local_1c0;
  int local_1b8;
  string local_1a8 [32];
  ostringstream local_188 [392];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  (**(code **)(*in_RSI + 0x58))(local_1a8,in_RSI,0,1);
  poVar2 = std::operator<<((ostream *)local_188,local_1a8);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_1a8);
  for (local_1b8 = 0; local_1b8 < 0x40; local_1b8 = local_1b8 + 1) {
    local_1c0 = BoardCore::getPiece(in_stack_fffffffffffffdb8,0);
    Piece::toString_abi_cxx11_
              ((PieceType)((ulong)in_stack_fffffffffffffde8 >> 0x20),(Side)in_stack_fffffffffffffde8
              );
    in_stack_fffffffffffffde8 = std::operator<<((ostream *)local_188,local_1e0);
    std::operator<<(in_stack_fffffffffffffde8," ");
    std::__cxx11::string::~string(local_1e0);
    if (0 < local_1b8) {
      iVar1 = (**(code **)(*in_RSI + 0x40))(in_RSI,local_1b8);
      if (iVar1 == 7) {
        iVar1 = (**(code **)(*in_RSI + 0x48))(in_RSI,local_1b8);
        poVar2 = std::operator<<((ostream *)local_188," ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,8 - iVar1);
        std::operator<<(poVar2,"\n");
      }
    }
  }
  std::operator<<((ostream *)local_188,"a b c d e f g h \n");
  poVar2 = std::operator<<((ostream *)local_188,"key: ");
  uVar3 = (**(code **)(*in_RSI + 0x60))();
  this_00 = (void *)std::ostream::operator<<(poVar2,uVar3);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

std::string ChessBoard::toString() const {
    
    std::ostringstream stringStream;
    
    stringStream << getFen() << std::endl;
    
    for (int i = 0; i<64; i++) {
        auto piece = getPiece(i);
        
        stringStream << Piece::toString(piece.type, piece.side) << " ";
        
        if (i > 0 && getColumn(i) == 7) {
            int row = 8 - getRow(i);
            stringStream << " " << row << "\n";
        }
    }
    
    stringStream << "a b c d e f g h \n";
    stringStream << "key: " << key() << std::endl;
    
    return stringStream.str();
}